

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O1

void __thiscall
Diligent::PipelineStateGLImpl::InitResourceLayout
          (PipelineStateGLImpl *this,PSO_CREATE_INTERNAL_FLAGS InternalFlags,
          TShaderStages *ShaderStages,SHADER_TYPE ActiveStages)

{
  ShaderGLImpl *pSVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  GLProgram *pGVar3;
  element_type *peVar4;
  SignatureAutoPtrType *pSVar5;
  PipelineResourceSignatureGLImpl *pPVar6;
  RefCountersImpl **ppRVar7;
  TBindings TVar8;
  PIPELINE_RESOURCE_FLAGS PVar9;
  LinkStatus LVar10;
  pointer ppSVar11;
  shared_ptr<const_Diligent::ShaderResourcesGL> *psVar12;
  RenderDeviceGLImpl *pRVar13;
  undefined4 in_register_0000000c;
  char (*Args_1) [99];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long lVar14;
  GLContextState *pGVar15;
  ulong uVar16;
  ulong uVar17;
  bool bIsDeviceInternal;
  element_type *local_178;
  string msg;
  shared_ptr<const_Diligent::ShaderResourcesGL> local_150;
  shared_ptr<const_Diligent::ShaderResourcesGL> local_140;
  GLContextState *local_130;
  PipelineStateGLImpl *local_128;
  shared_ptr<const_Diligent::ShaderResourcesGL> local_120;
  TBindings Bindings;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_108;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100;
  _Alloc_hider local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  pointer local_d0;
  pointer local_c0;
  pointer local_b8;
  pointer local_a8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a0;
  PipelineResourceSignatureDesc local_68;
  
  Args_1 = (char (*) [99])CONCAT44(in_register_0000000c,ActiveStages);
  if ((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_UsingImplicitSignature == true
     ) {
    if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) !=
        PSO_CREATE_INTERNAL_FLAG_NONE) {
      RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::Release
                ((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_Signatures);
    }
    GetDefaultSignatureDesc
              ((PipelineResourceSignatureDescWrapper *)&Bindings,this,ShaderStages,ActiveStages);
    Args_1 = (char (*) [99])&bIsDeviceInternal;
    bIsDeviceInternal = true;
    msg._M_dataplus._M_p._0_4_ =
         (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_ActiveShaderStages;
    PipelineStateBase<Diligent::EngineGLImplTraits>::
    InitDefaultSignature<Diligent::SHADER_TYPE,bool>
              (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>,&local_68,
               (SHADER_TYPE *)&msg,(bool *)Args_1);
    if (((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_Signatures)->m_pObject ==
        (PipelineResourceSignatureGLImpl *)0x0) {
      FormatString<char[26],char[16]>
                (&msg,(Diligent *)"Debug expression failed:\n",(char (*) [26])"m_Signatures[0]",
                 (char (*) [16])Args_1);
      Args_1 = (char (*) [99])0xbf;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"InitResourceLayout",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                 ,0xbf);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_a0);
    if (local_b8 != (pointer)0x0) {
      operator_delete(local_b8,(long)local_a8 - (long)local_b8);
    }
    if (local_d0 != (pointer)0x0) {
      operator_delete(local_d0,(long)local_c0 - (long)local_d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &local_e0) {
      operator_delete(local_f0._M_p,local_e0._M_allocated_capacity + 1);
    }
    if (Bindings._M_elems != (_Type)&local_100) {
      operator_delete((void *)Bindings._M_elems,local_100._M_allocated_capacity + 1);
    }
  }
  pRVar13 = (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
            .m_pDevice;
  if ((pRVar13->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pRVar13->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
      super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    Bindings._M_elems[0] = 0;
    Bindings._M_elems[1] = 0;
    Bindings._M_elems[2] = 0;
    Bindings._M_elems[3] = 0;
  }
  else {
    RefCntWeakPtr<Diligent::DeviceContextGLImpl>::Lock
              ((RefCntWeakPtr<Diligent::DeviceContextGLImpl> *)&Bindings);
  }
  TVar8._M_elems = Bindings._M_elems;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release
            ((RefCntAutoPtr<Diligent::DeviceContextGLImpl> *)&Bindings);
  if (TVar8._M_elems == (_Type)0x0) {
    FormatString<char[26],char[25]>
              ((string *)&Bindings,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"pImmediateCtx != nullptr",(char (*) [25])Args_1);
    Args_1 = (char (*) [99])0xc3;
    DebugAssertionFailed
              ((Char *)Bindings._M_elems,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xc3);
    if (Bindings._M_elems != (_Type)&local_100) {
      operator_delete((void *)Bindings._M_elems,local_100._M_allocated_capacity + 1);
    }
  }
  pGVar15 = (GLContextState *)((long)TVar8._M_elems + 0x750);
  local_130 = pGVar15;
  if (this->m_IsProgramPipelineSupported == true) {
    ppSVar11 = (ShaderStages->
               super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
               )._M_impl.super__Vector_impl_data._M_start;
    if ((ShaderStages->
        super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>).
        _M_impl.super__Vector_impl_data._M_finish != ppSVar11) {
      lVar14 = 0;
      uVar16 = 0;
      do {
        pSVar1 = ppSVar11[uVar16];
        local_178 = (pSVar1->m_pShaderResources).
                    super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
        p_Var2 = (pSVar1->m_pShaderResources).
                 super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        pGVar3 = *(GLProgram **)
                  ((long)&(this->m_GLPrograms->
                          super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + lVar14);
        if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          }
        }
        local_140.super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_178;
        local_140.super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var2;
        GLProgram::SetResources(pGVar3,&local_140);
        if (local_140.
            super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_140.
                     super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        local_150.super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = local_178;
        local_150.super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = p_Var2;
        ValidateShaderResources
                  (this,&local_150,
                   (pSVar1->super_ShaderBase<Diligent::EngineGLImplTraits>).
                   super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                   .m_Desc.super_DeviceObjectAttribs.Name,
                   (pSVar1->super_ShaderBase<Diligent::EngineGLImplTraits>).
                   super_DeviceObjectBase<Diligent::IShaderGL,_Diligent::RenderDeviceGLImpl,_Diligent::ShaderDesc>
                   .m_Desc.ShaderType);
        if (local_150.
            super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_150.
                     super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        uVar16 = uVar16 + 1;
        ppSVar11 = (ShaderStages->
                   super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        lVar14 = lVar14 + 0x10;
      } while (uVar16 < (ulong)((long)(ShaderStages->
                                      super__Vector_base<Diligent::ShaderGLImpl_*,_std::allocator<Diligent::ShaderGLImpl_*>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar11
                               >> 3));
    }
  }
  else {
    pGVar3 = (this->m_GLPrograms->
             super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if ((pGVar3 == (GLProgram *)0x0) ||
       (LVar10 = GLProgram::GetLinkStatus(pGVar3,false), LVar10 != Succeeded)) {
      FormatString<char[26],char[99]>
                ((string *)&Bindings,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "m_GLPrograms[0] != nullptr && m_GLPrograms[0]->GetLinkStatus() == GLProgram::LinkStatus::Succeeded"
                 ,Args_1);
      DebugAssertionFailed
                ((Char *)Bindings._M_elems,"InitResourceLayout",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                 ,0xd2);
      if (Bindings._M_elems != (_Type)&local_100) {
        operator_delete((void *)Bindings._M_elems,local_100._M_allocated_capacity + 1);
      }
    }
    peVar4 = (this->m_GLPrograms->
             super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    Bindings._M_elems =
         (_Type)(peVar4->m_pResources).
                super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
    _Stack_108._M_pi =
         (peVar4->m_pResources).
         super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if ((DeviceContextGLImpl *)_Stack_108._M_pi != (DeviceContextGLImpl *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ppRVar7 = &(((DeviceContextGLImpl *)_Stack_108._M_pi)->
                   super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                   super_ObjectBase<Diligent::IDeviceContextGL>.
                   super_RefCountedObject<Diligent::IDeviceContextGL>.m_pRefCounters;
        *(int *)ppRVar7 = *(int *)ppRVar7 + 1;
        UNLOCK();
      }
      else {
        ppRVar7 = &(((DeviceContextGLImpl *)_Stack_108._M_pi)->
                   super_DeviceContextBase<Diligent::EngineGLImplTraits>).
                   super_ObjectBase<Diligent::IDeviceContextGL>.
                   super_RefCountedObject<Diligent::IDeviceContextGL>.m_pRefCounters;
        *(int *)ppRVar7 = *(int *)ppRVar7 + 1;
      }
    }
    if (Bindings._M_elems == (_Type)0x0) {
      PVar9 = GetSamplerResourceFlag(this,ShaderStages,false);
      pGVar3 = (this->m_GLPrograms->
               super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      PVar9 = GetSamplerResourceFlag(this,ShaderStages,PVar9 != PIPELINE_RESOURCE_FLAG_NONE);
      psVar12 = GLProgram::LoadResources
                          (pGVar3,ActiveStages,PVar9,pGVar15,false,SHADER_SOURCE_LANGUAGE_DEFAULT);
      Bindings._M_elems =
           (_Type)(psVar12->
                  super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&_Stack_108,
                 &(psVar12->
                  super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_refcount);
    }
    local_120.super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)Bindings._M_elems;
    local_120.super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Stack_108._M_pi;
    Bindings._M_elems[0] = 0;
    Bindings._M_elems[1] = 0;
    Bindings._M_elems[2] = 0;
    Bindings._M_elems[3] = 0;
    _Stack_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ValidateShaderResources
              (this,&local_120,
               (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
               .m_Desc.super_DeviceObjectAttribs.Name,ActiveStages);
    if ((DeviceContextGLImpl *)
        local_120.super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (DeviceContextGLImpl *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_120.
                 super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    if ((DeviceContextGLImpl *)_Stack_108._M_pi != (DeviceContextGLImpl *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_108._M_pi);
    }
  }
  pGVar15 = local_130;
  Bindings._M_elems[0] = 0;
  Bindings._M_elems[1] = 0;
  Bindings._M_elems[2] = 0;
  Bindings._M_elems[3] = 0;
  if ((this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_SignatureCount != '\0') {
    uVar16 = 0;
    local_128 = this;
    do {
      pSVar5 = (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_Signatures;
      if (pSVar5[uVar16].m_pObject != (PipelineResourceSignatureGLImpl *)0x0) {
        *&this->m_BaseBindings[uVar16]._M_elems = Bindings._M_elems;
        if (this->m_NumPrograms != '\0') {
          lVar14 = 0;
          uVar17 = 0;
          do {
            GLProgram::ApplyBindings
                      (*(GLProgram **)
                        ((long)&(this->m_GLPrograms->
                                super___shared_ptr<Diligent::GLProgram,_(__gnu_cxx::_Lock_policy)2>)
                                ._M_ptr + lVar14),pSVar5[uVar16].m_pObject,pGVar15,&Bindings);
            uVar17 = uVar17 + 1;
            lVar14 = lVar14 + 0x10;
            this = local_128;
          } while (uVar17 < local_128->m_NumPrograms);
        }
        pPVar6 = pSVar5[uVar16].m_pObject;
        lVar14 = 0;
        do {
          Bindings._M_elems[lVar14] =
               Bindings._M_elems[lVar14] +
               *(short *)((long)(&(pPVar6->
                                  super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>)
                                  .m_StaticResStageIndex + 5) + lVar14 * 2 + 3);
          lVar14 = lVar14 + 1;
        } while (lVar14 != 4);
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < (this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_SignatureCount
            );
  }
  pRVar13 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
            ::GetDevice((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                         *)this);
  if ((uint)(pRVar13->m_DeviceLimits).MaxUniformBlocks < (uint)Bindings._M_elems[0]) {
    msg._M_dataplus._M_p = GetBindingRangeName(BINDING_RANGE_UNIFORM_BUFFER);
    LogError<true,char[34],char_const*,char[40],int,char[3]>
              (false,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xf8,(char (*) [34])"The number of bindings in range \'",(char **)&msg,
               (char (*) [40])"\' is greater than the maximum allowed (",
               &(pRVar13->m_DeviceLimits).MaxUniformBlocks,(char (*) [3])0x930cd5);
  }
  if ((uint)(pRVar13->m_DeviceLimits).MaxTextureUnits < (uint)Bindings._M_elems[1]) {
    msg._M_dataplus._M_p = GetBindingRangeName(BINDING_RANGE_TEXTURE);
    LogError<true,char[34],char_const*,char[40],int,char[3]>
              (false,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xfa,(char (*) [34])"The number of bindings in range \'",(char **)&msg,
               (char (*) [40])"\' is greater than the maximum allowed (",
               &(pRVar13->m_DeviceLimits).MaxTextureUnits,(char (*) [3])0x930cd5);
  }
  if ((uint)(pRVar13->m_DeviceLimits).MaxStorageBlock < (uint)Bindings._M_elems[3]) {
    msg._M_dataplus._M_p = GetBindingRangeName(BINDING_RANGE_STORAGE_BUFFER);
    LogError<true,char[34],char_const*,char[40],int,char[3]>
              (false,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xfc,(char (*) [34])"The number of bindings in range \'",(char **)&msg,
               (char (*) [40])"\' is greater than the maximum allowed (",
               &(pRVar13->m_DeviceLimits).MaxStorageBlock,(char (*) [3])0x930cd5);
  }
  if ((uint)(pRVar13->m_DeviceLimits).MaxImagesUnits < (uint)Bindings._M_elems[2]) {
    msg._M_dataplus._M_p = GetBindingRangeName(BINDING_RANGE_IMAGE);
    LogError<true,char[34],char_const*,char[40],int,char[3]>
              (false,"InitResourceLayout",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0xfe,(char (*) [34])"The number of bindings in range \'",(char **)&msg,
               (char (*) [40])"\' is greater than the maximum allowed (",
               &(pRVar13->m_DeviceLimits).MaxImagesUnits,(char (*) [3])0x930cd5);
  }
  return;
}

Assistant:

void PipelineStateGLImpl::InitResourceLayout(PSO_CREATE_INTERNAL_FLAGS InternalFlags,
                                             const TShaderStages&      ShaderStages,
                                             SHADER_TYPE               ActiveStages)
{
    if (m_UsingImplicitSignature)
    {
        if ((InternalFlags & PSO_CREATE_INTERNAL_FLAG_IMPLICIT_SIGNATURE0) != 0)
        {
            // Release deserialized default signature as it is empty in OpenGL.
            // We need to create a new one from scratch.
            m_Signatures[0].Release();
        }

        const auto SignDesc = GetDefaultSignatureDesc(ShaderStages, ActiveStages);
        // Always initialize default resource signature as internal device object.
        // This is necessary to avoid cyclic references from TexRegionRenderer.
        // This may never be a problem as the PSO keeps the reference to the device if necessary.
        constexpr bool bIsDeviceInternal = true;
        InitDefaultSignature(SignDesc, GetActiveShaderStages(), bIsDeviceInternal);
        VERIFY_EXPR(m_Signatures[0]);
    }

    DeviceContextGLImpl* pImmediateCtx = m_pDevice->GetImmediateContext(0);
    VERIFY_EXPR(pImmediateCtx != nullptr);
    auto& CtxState = pImmediateCtx->GetContextState();

    if (m_IsProgramPipelineSupported)
    {
        for (size_t i = 0; i < ShaderStages.size(); ++i)
        {
            const ShaderGLImpl*                      pShaderGL  = ShaderStages[i];
            std::shared_ptr<const ShaderResourcesGL> pResources = pShaderGL->GetShaderResources();
            m_GLPrograms[i]->SetResources(pResources);
            ValidateShaderResources(std::move(pResources), pShaderGL->GetDesc().Name, pShaderGL->GetDesc().ShaderType);
        }
    }
    else
    {
        VERIFY_EXPR(m_GLPrograms[0] != nullptr && m_GLPrograms[0]->GetLinkStatus() == GLProgram::LinkStatus::Succeeded);

        std::shared_ptr<const ShaderResourcesGL> pResources = m_GLPrograms[0]->GetResources();
        if (!pResources)
        {
            // If resources are not loaded yet for this program, load them now
            const auto SamplerResFlag = GetSamplerResourceFlag(ShaderStages, false /*SilenceWarning*/);

            pResources = m_GLPrograms[0]->LoadResources(
                ActiveStages,
                GetSamplerResourceFlag(ShaderStages, SamplerResFlag),
                CtxState);
        }
        ValidateShaderResources(std::move(pResources), m_Desc.Name, ActiveStages);
    }

    // Apply resource bindings to programs.
    PipelineResourceSignatureGLImpl::TBindings Bindings = {};
    for (Uint32 s = 0; s < m_SignatureCount; ++s)
    {
        const auto& pSignature = m_Signatures[s];
        if (pSignature == nullptr)
            continue;

        m_BaseBindings[s] = Bindings;
        for (Uint32 p = 0; p < m_NumPrograms; ++p)
        {
            // GL programs are keyed by shader IDs and resource signature IDs or resource layout.
            // Consequently, any pipeline that uses a cached program will assign the same bindings.
            m_GLPrograms[p]->ApplyBindings(pSignature, CtxState, Bindings);
        }

        pSignature->ShiftBindings(Bindings);
    }

    const auto& Limits = GetDevice()->GetDeviceLimits();

    if (Bindings[BINDING_RANGE_UNIFORM_BUFFER] > static_cast<Uint32>(Limits.MaxUniformBlocks))
        LOG_ERROR_AND_THROW("The number of bindings in range '", GetBindingRangeName(BINDING_RANGE_UNIFORM_BUFFER), "' is greater than the maximum allowed (", Limits.MaxUniformBlocks, ").");
    if (Bindings[BINDING_RANGE_TEXTURE] > static_cast<Uint32>(Limits.MaxTextureUnits))
        LOG_ERROR_AND_THROW("The number of bindings in range '", GetBindingRangeName(BINDING_RANGE_TEXTURE), "' is greater than the maximum allowed (", Limits.MaxTextureUnits, ").");
    if (Bindings[BINDING_RANGE_STORAGE_BUFFER] > static_cast<Uint32>(Limits.MaxStorageBlock))
        LOG_ERROR_AND_THROW("The number of bindings in range '", GetBindingRangeName(BINDING_RANGE_STORAGE_BUFFER), "' is greater than the maximum allowed (", Limits.MaxStorageBlock, ").");
    if (Bindings[BINDING_RANGE_IMAGE] > static_cast<Uint32>(Limits.MaxImagesUnits))
        LOG_ERROR_AND_THROW("The number of bindings in range '", GetBindingRangeName(BINDING_RANGE_IMAGE), "' is greater than the maximum allowed (", Limits.MaxImagesUnits, ").");
}